

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageMultisampleLoadStoreTests.cpp
# Opt level: O0

void vkt::image::anon_unknown_1::checkRequirements
               (InstanceInterface *vki,VkPhysicalDevice physDevice,CaseDef *caseDef)

{
  int iVar1;
  NotSupportedError *pNVar2;
  undefined1 local_130 [4];
  VkResult imageFormatResult;
  VkImageFormatProperties imageFormatProperties;
  undefined1 local_fc [8];
  VkPhysicalDeviceFeatures features;
  CaseDef *caseDef_local;
  VkPhysicalDevice physDevice_local;
  InstanceInterface *vki_local;
  
  features._212_8_ = caseDef;
  (*vki->_vptr_InstanceInterface[2])(vki,physDevice,local_fc);
  if (features.shaderImageGatherExtended == 0) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,"Multisampled storage images are not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageMultisampleLoadStoreTests.cpp"
               ,0xb9);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  iVar1 = (*vki->_vptr_InstanceInterface[4])
                    (vki,physDevice,(ulong)*(uint *)(features._212_8_ + 0x18),1,0,8,0,local_130);
  if (iVar1 == -0xb) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,"Format is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageMultisampleLoadStoreTests.cpp"
               ,0xc0);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((imageFormatProperties.maxMipLevels & *(uint *)(features._212_8_ + 0x1c)) !=
      *(uint *)(features._212_8_ + 0x1c)) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,"Requested sample count is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageMultisampleLoadStoreTests.cpp"
               ,0xc3);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  return;
}

Assistant:

void checkRequirements (const InstanceInterface& vki, const VkPhysicalDevice physDevice, const CaseDef& caseDef)
{
	VkPhysicalDeviceFeatures	features;
	vki.getPhysicalDeviceFeatures(physDevice, &features);

	if (!features.shaderStorageImageMultisample)
		TCU_THROW(NotSupportedError, "Multisampled storage images are not supported");

	VkImageFormatProperties		imageFormatProperties;
	const VkResult				imageFormatResult		= vki.getPhysicalDeviceImageFormatProperties(
		physDevice, caseDef.format, VK_IMAGE_TYPE_2D, VK_IMAGE_TILING_OPTIMAL, VK_IMAGE_USAGE_STORAGE_BIT, (VkImageCreateFlags)0, &imageFormatProperties);

	if (imageFormatResult == VK_ERROR_FORMAT_NOT_SUPPORTED)
		TCU_THROW(NotSupportedError, "Format is not supported");

	if ((imageFormatProperties.sampleCounts & caseDef.numSamples) != caseDef.numSamples)
		TCU_THROW(NotSupportedError, "Requested sample count is not supported");
}